

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O0

__m256i * highbd_clamp_epi16_avx2(__m256i u,int bd)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  uint in_EDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined8 in_YMM0_H;
  undefined8 in_register_00001218;
  __m256i mask;
  __m256i clamped;
  __m256i max;
  __m256i one;
  __m256i zero;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  auVar1 = vpinsrw_avx(ZEXT216(1),1,1);
  auVar1 = vpinsrw_avx(auVar1,1,2);
  auVar1 = vpinsrw_avx(auVar1,1,3);
  auVar1 = vpinsrw_avx(auVar1,1,4);
  auVar1 = vpinsrw_avx(auVar1,1,5);
  auVar1 = vpinsrw_avx(auVar1,1,6);
  auVar1 = vpinsrw_avx(auVar1,1,7);
  auVar2 = vpinsrw_avx(ZEXT216(1),1,1);
  auVar2 = vpinsrw_avx(auVar2,1,2);
  auVar2 = vpinsrw_avx(auVar2,1,3);
  auVar2 = vpinsrw_avx(auVar2,1,4);
  auVar2 = vpinsrw_avx(auVar2,1,5);
  auVar2 = vpinsrw_avx(auVar2,1,6);
  auVar2 = vpinsrw_avx(auVar2,1,7);
  uStack_70 = auVar2._0_8_;
  uStack_68 = auVar2._8_8_;
  auVar4._16_8_ = uStack_70;
  auVar4._0_16_ = auVar1;
  auVar4._24_8_ = uStack_68;
  auVar4 = vpsllw_avx2(auVar4,ZEXT416(in_EDI));
  auVar3._16_8_ = uStack_70;
  auVar3._0_16_ = auVar1;
  auVar3._24_8_ = uStack_68;
  auVar5 = vpsubw_avx2(auVar4,auVar3);
  auVar6._8_8_ = in_XMM0_Qb;
  auVar6._0_8_ = in_XMM0_Qa;
  auVar6._16_8_ = in_YMM0_H;
  auVar6._24_8_ = in_register_00001218;
  auVar4 = vpcmpgtw_avx2(auVar6,auVar5);
  auVar7._8_8_ = in_XMM0_Qb;
  auVar7._0_8_ = in_XMM0_Qa;
  auVar7._16_8_ = in_YMM0_H;
  auVar7._24_8_ = in_register_00001218;
  auVar3 = vpandn_avx2(auVar4,auVar7);
  auVar4 = vpand_avx2(auVar4,auVar5);
  auVar3 = vpor_avx2(auVar4,auVar3);
  auVar4 = vpcmpgtw_avx2(auVar3,ZEXT1632(ZEXT816(0)));
  vpand_avx2(auVar3,auVar4);
  return (__m256i *)(ulong)in_EDI;
}

Assistant:

static inline __m256i highbd_clamp_epi16_avx2(__m256i u, int bd) {
  const __m256i zero = _mm256_setzero_si256();
  const __m256i one = _mm256_set1_epi16(1);
  const __m256i max = _mm256_sub_epi16(_mm256_slli_epi16(one, bd), one);
  __m256i clamped, mask;

  mask = _mm256_cmpgt_epi16(u, max);
  clamped = _mm256_andnot_si256(mask, u);
  mask = _mm256_and_si256(mask, max);
  clamped = _mm256_or_si256(mask, clamped);
  mask = _mm256_cmpgt_epi16(clamped, zero);
  clamped = _mm256_and_si256(clamped, mask);

  return clamped;
}